

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O0

bool __thiscall
RealCommandRunner::WaitForCommand(RealCommandRunner *this,Result *result,bool more_ready)

{
  Subprocess *pSVar1;
  bool bVar2;
  ExitStatus EVar3;
  string *psVar4;
  pointer ppVar5;
  TokenPool *local_70;
  byte local_59;
  iterator local_40;
  iterator e;
  Subprocess *pSStack_30;
  bool interrupted;
  Subprocess *subproc;
  Result *pRStack_20;
  bool more_ready_local;
  Result *result_local;
  RealCommandRunner *this_local;
  
  subproc._7_1_ = more_ready;
  pRStack_20 = result;
  result_local = (Result *)this;
  SubprocessSet::ResetTokenAvailable(&this->subprocs_);
  do {
    pSStack_30 = SubprocessSet::NextFinished(&this->subprocs_);
    local_59 = 0;
    if (pSStack_30 == (Subprocess *)0x0) {
      bVar2 = SubprocessSet::IsTokenAvailable(&this->subprocs_);
      local_59 = bVar2 ^ 0xff;
    }
    if ((local_59 & 1) == 0) {
      if (pSStack_30 == (Subprocess *)0x0) {
        pRStack_20->status = ExitTokenAvailable;
        return true;
      }
      if (this->tokens_ != (TokenPool *)0x0) {
        (*this->tokens_->_vptr_TokenPool[4])();
      }
      EVar3 = Subprocess::Finish(pSStack_30);
      pRStack_20->status = EVar3;
      psVar4 = Subprocess::GetOutput_abi_cxx11_(pSStack_30);
      std::__cxx11::string::operator=((string *)&pRStack_20->output,(string *)psVar4);
      local_40 = std::
                 map<const_Subprocess_*,_Edge_*,_std::less<const_Subprocess_*>,_std::allocator<std::pair<const_Subprocess_*const,_Edge_*>_>_>
                 ::find(&this->subproc_to_edge_,&stack0xffffffffffffffd0);
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_Subprocess_*const,_Edge_*>_>::operator->
                         (&local_40);
      pRStack_20->edge = ppVar5->second;
      std::
      map<Subprocess_const*,Edge*,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
      ::erase_abi_cxx11_((map<Subprocess_const*,Edge*,std::less<Subprocess_const*>,std::allocator<std::pair<Subprocess_const*const,Edge*>>>
                          *)&this->subproc_to_edge_,local_40);
      pSVar1 = pSStack_30;
      if (pSStack_30 != (Subprocess *)0x0) {
        Subprocess::~Subprocess(pSStack_30);
        operator_delete(pSVar1,0x30);
      }
      return true;
    }
    if ((subproc._7_1_ & 1) == 0) {
      local_70 = (TokenPool *)0x0;
    }
    else {
      local_70 = this->tokens_;
    }
    e._M_node._7_1_ = SubprocessSet::DoWork(&this->subprocs_,local_70);
  } while (!(bool)e._M_node._7_1_);
  return false;
}

Assistant:

bool RealCommandRunner::WaitForCommand(Result* result, bool more_ready) {
  Subprocess* subproc;
  subprocs_.ResetTokenAvailable();
  while (((subproc = subprocs_.NextFinished()) == NULL) &&
         !subprocs_.IsTokenAvailable()) {
    bool interrupted = subprocs_.DoWork(more_ready ? tokens_ : NULL);
    if (interrupted)
      return false;
  }

  // token became available
  if (subproc == NULL) {
    result->status = ExitTokenAvailable;
    return true;
  }

  // command completed
  if (tokens_)
    tokens_->Release();

  result->status = subproc->Finish();
  result->output = subproc->GetOutput();

  map<const Subprocess*, Edge*>::iterator e = subproc_to_edge_.find(subproc);
  result->edge = e->second;
  subproc_to_edge_.erase(e);

  delete subproc;
  return true;
}